

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

bool __thiscall
cmFileListGeneratorGlob::Search(cmFileListGeneratorGlob *this,string *parent,cmFileList *lister)

{
  bool bVar1;
  bool bVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  pointer inName;
  string expr;
  Glob g;
  string local_a0;
  Glob local_80;
  
  std::__cxx11::string::string((string *)&local_a0,(string *)parent);
  std::__cxx11::string::append((string *)&local_a0);
  cmsys::Glob::Glob(&local_80);
  bVar1 = cmsys::Glob::FindFiles(&local_80,&local_a0,(GlobMessages *)0x0);
  if (bVar1) {
    pvVar3 = cmsys::Glob::GetFiles_abi_cxx11_(&local_80);
    for (inName = (pvVar3->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        bVar1 = inName != (pvVar3->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish, bVar1; inName = inName + 1) {
      bVar2 = cmsys::SystemTools::FileIsDirectory(inName);
      if (bVar2) {
        bVar2 = cmFileListGeneratorBase::Consider
                          (&this->super_cmFileListGeneratorBase,inName,lister);
        if (bVar2) break;
      }
    }
  }
  else {
    bVar1 = false;
  }
  cmsys::Glob::~Glob(&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  return bVar1;
}

Assistant:

bool Search(std::string const& parent, cmFileList& lister) CM_OVERRIDE
  {
    // Glob the set of matching files.
    std::string expr = parent;
    expr += this->Pattern;
    cmsys::Glob g;
    if (!g.FindFiles(expr)) {
      return false;
    }
    std::vector<std::string> const& files = g.GetFiles();

    // Look for directories among the matches.
    for (std::vector<std::string>::const_iterator fi = files.begin();
         fi != files.end(); ++fi) {
      if (cmSystemTools::FileIsDirectory(*fi)) {
        if (this->Consider(*fi, lister)) {
          return true;
        }
      }
    }
    return false;
  }